

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

void __thiscall bwtil::cw_bwt::build(cw_bwt *this)

{
  undefined1 auVar1 [16];
  byte bVar2;
  symbol sVar3;
  int iVar4;
  reference pvVar5;
  ostream *poVar6;
  void *this_00;
  FILE *in_RSI;
  long in_RDI;
  int last_percentage;
  int perc;
  symbol tail;
  symbol head;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> context_char;
  ulint new_terminator_pos;
  ulint new_terminator_context;
  ulint terminator_pos;
  ulint terminator_context;
  ulint pos;
  symbol in_stack_fffffffffffffeff;
  ContextAutomata *in_stack_ffffffffffffff00;
  ulint in_stack_ffffffffffffff08;
  symbol sVar7;
  PartialSums *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  PartialSums *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  ostream *in_stack_ffffffffffffff40;
  ostream *in_stack_ffffffffffffff48;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  int local_6c;
  uint local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  uint8_t *local_30;
  ulint local_28;
  uint8_t *local_20;
  ulint local_18;
  ulong local_10;
  
  local_10 = *(long *)(in_RDI + 0x18) - 1;
  ContextAutomata::rewind((ContextAutomata *)(in_RDI + 0x20),in_RSI);
  (**(code **)(**(long **)(in_RDI + 0xd0) + 0x10))();
  local_18 = ContextAutomata::currentState((ContextAutomata *)(in_RDI + 0x20));
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x156314);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (allocator_type *)in_stack_ffffffffffffff10);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x156340);
  for (local_60 = 0; local_60 < *(uint *)(in_RDI + 0xc4); local_60 = local_60 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_48,(ulong)local_60);
    *pvVar5 = '\0';
  }
  local_20 = (uint8_t *)0x0;
  if ((*(byte *)(in_RDI + 0xc0) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "\n*** Main cw-bwt algorithm (context-wise incremental construction of the BWT) *** "
                            );
    this_00 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_6c = -1;
  while( true ) {
    sVar7 = (symbol)(in_stack_ffffffffffffff08 >> 0x38);
    bVar2 = (**(code **)(**(long **)(in_RDI + 0xd0) + 0x20))();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    iVar4 = (int)((((*(long *)(in_RDI + 0x18) - local_10) + -1) * 100) / *(ulong *)(in_RDI + 0x18));
    if (((iVar4 % 5 == 0) && (local_6c < iVar4)) && ((*(byte *)(in_RDI + 0xc0) & 1) != 0)) {
      in_stack_ffffffffffffff50 =
           (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
           std::operator<<((ostream *)&std::cout," ");
      in_stack_ffffffffffffff48 =
           (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff50,iVar4);
      in_stack_ffffffffffffff40 = std::operator<<(in_stack_ffffffffffffff48,"% done.");
      std::ostream::operator<<(in_stack_ffffffffffffff40,std::endl<char,std::char_traits<char>>);
      local_6c = iVar4;
    }
    (**(code **)(**(long **)(in_RDI + 0xd0) + 0x18))();
    sVar3 = ContextAutomata::ASCIItoCode(in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
    this_01 = (PartialSums *)0x0;
    this_02 = &local_48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              (this_02,local_10 % (ulong)*(uint *)(in_RDI + 0xc4));
    auVar1._8_8_ = this_01;
    auVar1._0_8_ = local_10;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (this_02,SUB168(auVar1 % ZEXT416(*(uint *)(in_RDI + 0xc4)),0));
    *pvVar5 = sVar3;
    ContextAutomata::goTo(in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
    local_28 = ContextAutomata::currentState((ContextAutomata *)(in_RDI + 0x20));
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::operator[]
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)(in_RDI + 0xd8),
               local_28);
    PartialSums::increment(in_stack_ffffffffffffff10,sVar7);
    sVar7 = (symbol)((ulong)in_stack_ffffffffffffff10 >> 0x38);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::operator[]
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)(in_RDI + 0xd8),
               local_28);
    in_stack_ffffffffffffff10 = (PartialSums *)PartialSums::getCount(this_01,sVar7);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::operator[]((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                  *)(in_RDI + 0xf0),local_18);
    in_stack_ffffffffffffff08 =
         DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
                   ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
                    CONCAT17(bVar2,in_stack_ffffffffffffff58),
                    (symbol)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                    (ulint)in_stack_ffffffffffffff48);
    local_30 = &in_stack_ffffffffffffff10->sigma + in_stack_ffffffffffffff08;
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::operator[]((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                  *)(in_RDI + 0xf0),local_18);
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
              (in_stack_ffffffffffffff50,(symbol)((ulong)in_stack_ffffffffffffff48 >> 0x38),
               (ulint)in_stack_ffffffffffffff40);
    local_18 = local_28;
    local_20 = local_30;
    local_10 = local_10 - 1;
  }
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::operator[]((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                *)(in_RDI + 0xf0),local_18);
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
            (in_stack_ffffffffffffff50,(symbol)((ulong)in_stack_ffffffffffffff48 >> 0x38),
             (ulint)in_stack_ffffffffffffff40);
  (**(code **)(**(long **)(in_RDI + 0xd0) + 0x28))();
  if ((*(byte *)(in_RDI + 0xc0) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout," Done.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void build(){

		ulint pos = n-1;//current position on text (char to be inserted in the bwt)
		ulint terminator_context,terminator_pos, new_terminator_context,new_terminator_pos;//coordinates of the terminator character

		ca.rewind();//go back to first state
		bwIt->rewind();

		//context of length k before position n (excluded):
		terminator_context = ca.currentState();//context
		vector<symbol> context_char = vector<symbol>(k);//context in char format

		for(uint i=0;i<k;i++)
			context_char[i] = 0;

		//memorize position of the terminator
		terminator_pos = 0;

		//now start main algorithm

		symbol head,tail;//head=symbol to be inserted, tail=symbol exiting from the context

		if(verbose) cout << "\n*** Main cw-bwt algorithm (context-wise incremental construction of the BWT) *** " << endl << endl;

		int perc,last_percentage=-1;

		/*ulint char_inserted = 0;
		vector<double> times;

	    using std::chrono::high_resolution_clock;
	    using std::chrono::duration_cast;
	    using std::chrono::duration;

	    auto t1 = high_resolution_clock::now();*/

		while(not bwIt->begin()){

			perc = (100*(n-pos-1))/n;

			if((perc%5==0) and (perc>last_percentage) and verbose){
				cout << " " << perc << "% done." << endl;
				last_percentage = perc;
			}

			head = ca.ASCIItoCode( bwIt->read() );//this symbol has context corresponding to ca.currentState(). symbol entering from left in context
			tail = context_char[pos%k];// = (pos+k)%k . Symbol exiting from right of the context

			context_char[pos%k] = head;//buffer head symbol, overwriting the symbol exiting from tail of the context

			ca.goTo(head);
			new_terminator_context = ca.currentState();

			//substitute the terminator with the symbol head (coordinates terminator_context,terminator_pos)

			partial_sums[new_terminator_context].increment(tail);

			new_terminator_pos = partial_sums[new_terminator_context].getCount(tail) +  dynStrings[terminator_context].rank(head,terminator_pos);

			dynStrings[terminator_context].insert(head,terminator_pos);

			//update terminator coordinates

			terminator_context = new_terminator_context;
			terminator_pos = new_terminator_pos;

			/*{//print also time benchmarks

				//number of chars processed until now
				char_inserted = n-pos;

				//sample time every 500k chars
				if(char_inserted%500000==0)
					times.push_back( duration_cast<duration<double, std::ratio<1>>>(high_resolution_clock::now() - t1).count() );

			}*/


			pos--;

		}

		dynStrings[terminator_context].insert(TERMINATOR,terminator_pos);//insert the terminator character

		bwIt->close();//close input file

		if(verbose) cout << " Done." << endl;

		/*{//print time benchmarks

			cout << "\nRunning times (seconds) every 500k characters:" << endl;

			for(ulint i=0;i<times.size();i++)
				cout << times.at(i) << "\n";

			cout << endl;

		}*/

	}